

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int MatroskaDemuxer::matroska_ebmlnum_uint(uint8_t *data,int32_t size,uint64_t *num)

{
  ulong uVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  ulong uVar7;
  long lVar6;
  
  uVar4 = 0xffffffff;
  if (0 < size) {
    uVar2 = (uint)*data;
    if ((char)*data < '\0') {
      uVar1 = (ulong)(uVar2 & 0x7f);
      uVar2 = (uint)(uVar1 == 0x7f);
      uVar4 = 1;
    }
    else {
      uVar7 = 0x80;
      lVar5 = 0;
      do {
        lVar6 = lVar5;
        lVar5 = lVar6 + 1;
        uVar7 = uVar7 >> 1;
        uVar4 = (uint)lVar5;
        if (7 < uVar4) break;
      } while (((uint)uVar7 & uVar2) == 0);
      if (size <= (int)uVar4 || 7 < uVar4) {
        return -1;
      }
      uVar4 = (int)lVar6 + 2;
      uVar1 = (ulong)(uVar2 & (uint)(uVar7 - 1));
      uVar2 = (uint)(uVar1 == uVar7 - 1);
      pbVar3 = data + 1;
      do {
        uVar2 = uVar2 + ((ulong)*pbVar3 == 0xff);
        uVar1 = uVar1 << 8 | (ulong)*pbVar3;
        pbVar3 = pbVar3 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    uVar7 = 0xffffffffffffffff;
    if (uVar4 != uVar2) {
      uVar7 = uVar1;
    }
    *num = uVar7;
  }
  return uVar4;
}

Assistant:

int MatroskaDemuxer::matroska_ebmlnum_uint(const uint8_t *data, const int32_t size, uint64_t *num)
{
    int read = 1, n = 1, num_ffs = 0;
    uint64_t len_mask = 0x80;

    if (size <= 0)
        return AVERROR_INVALIDDATA;

    uint64_t total = data[0];
    while (read <= 8 && !(total & len_mask))
    {
        read++;
        len_mask >>= 1;
    }
    if (read > 8)
        return AVERROR_INVALIDDATA;

    if ((total &= (len_mask - 1)) == len_mask - 1)
        num_ffs++;
    if (size < read)
        return AVERROR_INVALIDDATA;
    while (n < read)
    {
        if (data[n] == 0xff)
            num_ffs++;
        total = (total << 8) | data[n];
        n++;
    }

    if (read == num_ffs)
        *num = ULLONG_MAX;
    else
        *num = total;

    return read;
}